

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.hpp
# Opt level: O0

void __thiscall Item::Item(Item *this,int _ndims)

{
  size_type __n;
  allocator<int> local_31;
  vector<int,_std::allocator<int>_> local_30;
  int local_14;
  Item *pIStack_10;
  int _ndims_local;
  Item *this_local;
  
  local_14 = _ndims;
  pIStack_10 = this;
  std::vector<int,_std::allocator<int>_>::vector(&this->w);
  std::vector<int,_std::allocator<int>_>::vector(&this->nonzero);
  this->ndims = local_14;
  __n = (size_type)local_14;
  std::allocator<int>::allocator(&local_31);
  std::vector<int,_std::allocator<int>_>::vector(&local_30,__n,&local_31);
  std::vector<int,_std::allocator<int>_>::operator=(&this->w,&local_30);
  std::vector<int,_std::allocator<int>_>::~vector(&local_30);
  std::allocator<int>::~allocator(&local_31);
  return;
}

Assistant:

explicit Item(int _ndims) : ndims(_ndims) {
		w = std::vector<int>(_ndims);
	}